

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O3

void al_nssleep(unsigned_long nsec)

{
  int iVar1;
  int *piVar2;
  timespec ts;
  timespec rem;
  timespec local_38;
  timespec local_28;
  
  local_38.tv_sec = nsec / 1000000000;
  local_38.tv_nsec = nsec % 1000000000;
  iVar1 = nanosleep(&local_38,&local_28);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    do {
      if (*piVar2 != 4) {
        return;
      }
      local_38.tv_sec = local_28.tv_sec;
      local_38.tv_nsec = local_28.tv_nsec;
      iVar1 = nanosleep(&local_38,&local_28);
    } while (iVar1 == -1);
  }
  return;
}

Assistant:

void al_nssleep(unsigned long nsec)
{
    struct timespec ts, rem;
    ts.tv_sec = (time_t)(nsec / 1000000000ul);
    ts.tv_nsec = (long)(nsec % 1000000000ul);
    while(nanosleep(&ts, &rem) == -1 && errno == EINTR)
        ts = rem;
}